

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

string_view __thiscall inja::convert_dot_to_json_pointer(inja *this,string_view dot,string *out)

{
  const_pointer pcVar1;
  string_view *psVar2;
  const_pointer pcVar3;
  inja *piVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  psVar2 = (string_view *)dot.size_;
  pcVar1 = dot.data_;
  psVar2->size_ = 0;
  *psVar2->data_ = '\0';
  do {
    local_40.data_ = (const_pointer)CONCAT71(local_40.data_._1_7_,0x2e);
    bVar6.size_ = 1;
    bVar6.data_ = (const_pointer)&local_40;
    local_50.data_ = (const_pointer)this;
    local_50.size_ = (size_type)pcVar1;
    pcVar1 = (const_pointer)
             nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                       (&local_50,bVar6,0);
    if (pcVar1 == (const_pointer)0xffffffffffffffff) {
      bVar6 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
      piVar4 = (inja *)local_50.data_;
    }
    else {
      local_40.data_ = local_50.data_;
      local_40.size_ = local_50.size_;
      pcVar3 = (const_pointer)local_50.size_;
      if (pcVar1 < local_50.size_) {
        pcVar3 = pcVar1;
      }
      bVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_40,0,(size_type)pcVar3);
      local_40.data_ = local_50.data_;
      local_40.size_ = local_50.size_;
      pcVar3 = pcVar1 + 1;
      if (local_50.size_ < pcVar1 + 1) {
        pcVar3 = (const_pointer)local_50.size_;
      }
      bVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_40,(size_type)pcVar3,local_50.size_ - (long)pcVar3);
      piVar4 = (inja *)bVar5.data_;
    }
    pcVar1 = (const_pointer)bVar6.size_;
    this = (inja *)bVar6.data_;
    std::__cxx11::string::push_back((char)dot.size_);
    std::__cxx11::string::replace((ulong)psVar2,psVar2->size_,(char *)0x0,(ulong)piVar4);
  } while (pcVar1 != (const_pointer)0x0);
  return *psVar2;
}

Assistant:

inline nonstd::string_view convert_dot_to_json_pointer(nonstd::string_view dot, std::string& out) {
	out.clear();
	do {
		nonstd::string_view part;
		std::tie(part, dot) = string_view::split(dot, '.');
		out.push_back('/');
		out.append(part.begin(), part.end());
	} while (!dot.empty());
	return nonstd::string_view(out.data(), out.size());
}